

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O0

bool pbrt::InsidePolkaDot(Point2f st)

{
  Vector2<float> v;
  Point2<float> p;
  float *pfVar1;
  Float FVar2;
  float fVar3;
  type tVar4;
  float fVar5;
  double dVar6;
  double dVar7;
  undefined1 in_ZMM0 [64];
  undefined1 auVar8 [64];
  float fVar9;
  Float unaff_retaddr;
  Float unaff_retaddr_00;
  Vector2f dst;
  Float tCenter;
  Float sCenter;
  Float maxShift;
  Float radius;
  int tCell;
  int sCell;
  float y;
  float x;
  float in_stack_ffffffffffffffbc;
  Tuple2<pbrt::Point2,_float> local_c;
  Float in_stack_fffffffffffffffc;
  undefined1 extraout_var [56];
  
  local_c = (Tuple2<pbrt::Point2,_float>)vmovlpd_avx(in_ZMM0._0_16_);
  pfVar1 = Tuple2<pbrt::Point2,_float>::operator[](&local_c,0);
  dVar6 = pstd::floor((double)(ulong)(uint)(*pfVar1 + 0.5));
  pfVar1 = Tuple2<pbrt::Point2,_float>::operator[](&local_c,1);
  dVar7 = pstd::floor((double)(ulong)(uint)(*pfVar1 + 0.5));
  FVar2 = Noise(unaff_retaddr_00,unaff_retaddr,in_stack_fffffffffffffffc);
  if (0.0 < FVar2) {
    x = 0.5;
    fVar5 = 0.15;
    fVar3 = (float)(int)SUB84(dVar6,0);
    y = fVar5;
    Noise(unaff_retaddr_00,unaff_retaddr,in_stack_fffffffffffffffc);
    fVar9 = (float)(int)SUB84(dVar7,0);
    Noise(unaff_retaddr_00,unaff_retaddr,in_stack_fffffffffffffffc);
    Point2<float>::Point2((Point2<float> *)CONCAT44(fVar5,fVar3),x,y);
    p.super_Tuple2<pbrt::Point2,_float>.y = in_stack_ffffffffffffffbc;
    p.super_Tuple2<pbrt::Point2,_float>.x = fVar9;
    auVar8._0_8_ = Point2<float>::operator-((Point2<float> *)CONCAT44(fVar5,fVar3),p);
    auVar8._8_56_ = extraout_var;
    vmovlpd_avx(auVar8._0_16_);
    v.super_Tuple2<pbrt::Vector2,_float>.y = fVar5;
    v.super_Tuple2<pbrt::Vector2,_float>.x = fVar3;
    tVar4 = LengthSquared<float>(v);
    fVar5 = Sqr<float>(0.35);
    if (tVar4 < fVar5) {
      return true;
    }
  }
  return false;
}

Assistant:

bool InsidePolkaDot(Point2f st) {
    // Compute cell indices (_sCell_,_tCell_ for dots
    int sCell = pstd::floor(st[0] + .5f), tCell = pstd::floor(st[1] + .5f);

    if (Noise(sCell + .5f, tCell + .5f) > 0) {
        // Determine dot position and test if _st_ is inside it
        Float radius = .35f;
        Float maxShift = 0.5f - radius;
        Float sCenter = sCell + maxShift * Noise(sCell + 1.5f, tCell + 2.8f);
        Float tCenter = tCell + maxShift * Noise(sCell + 4.5f, tCell + 9.8f);
        Vector2f dst = st - Point2f(sCenter, tCenter);
        if (LengthSquared(dst) < Sqr(radius))
            return true;
    }
    return false;
}